

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystem.h
# Opt level: O2

void __thiscall llvm::sys::fs::detail::DirIterState::~DirIterState(DirIterState *this)

{
  directory_iterator_destruct(this);
  std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

~DirIterState() {
      directory_iterator_destruct(*this);
    }